

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Extrapolation anon_unknown.dwarf_d436::getExtrapolation(string *str)

{
  bool bVar1;
  ostream *poVar2;
  invalid_argument *this;
  string *in_RDI;
  stringstream e_1;
  Extrapolation e;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [380];
  Extrapolation local_c;
  string *local_8;
  
  local_8 = in_RDI;
  bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) {
    local_c = BLACK;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    if ((bVar1) ||
       (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) {
      local_c = CLAMP;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      if ((bVar1) ||
         (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) {
        local_c = PERIODIC;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        if ((!bVar1) &&
           (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), !bVar1)) {
          std::__cxx11::stringstream::stringstream(local_198);
          poVar2 = std::operator<<(local_188,"Unknown extrapolation method \"");
          poVar2 = std::operator<<(poVar2,local_8);
          std::operator<<(poVar2,"\"");
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringstream::str();
          std::invalid_argument::invalid_argument(this,local_1c8);
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        local_c = MIRROR;
      }
    }
  }
  return local_c;
}

Assistant:

Extrapolation
getExtrapolation (const string& str)
{
    Extrapolation e;

    if (str == "black" || str == "BLACK") { e = BLACK; }
    else if (str == "clamp" || str == "CLAMP") { e = CLAMP; }
    else if (str == "periodic" || str == "PERIODIC") { e = PERIODIC; }
    else if (str == "mirror" || str == "MIRROR") { e = MIRROR; }
    else
    {
        std::stringstream e;
        e << "Unknown extrapolation method \"" << str << "\"";
        throw invalid_argument (e.str ());
    }

    return e;
}